

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O3

idx_t duckdb::FindStrInStr(uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size)

{
  short sVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uchar *haystack_00;
  short *psVar5;
  uint *puVar6;
  long lVar7;
  long *plVar8;
  idx_t needle_size_00;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  
  haystack_00 = (uchar *)memchr(haystack,(uint)*needle,haystack_size);
  if (haystack_00 == (uchar *)0x0) {
    return 0xffffffffffffffff;
  }
  iVar10 = (long)haystack_00 - (long)haystack;
  uVar11 = haystack_size - iVar10;
  switch(needle_size) {
  case 1:
    return iVar10;
  case 2:
    if (1 < uVar11) {
      sVar1 = *(short *)needle;
      uVar9 = 0;
      do {
        psVar5 = (short *)memchr(haystack_00 + uVar9,(uint)(byte)sVar1,(uVar11 - 1) - uVar9);
        if (psVar5 == (short *)0x0) {
          return 0xffffffffffffffff;
        }
        lVar7 = (long)psVar5 - (long)haystack_00;
        if (sVar1 == *psVar5) {
LAB_010f7fdc:
          return lVar7 + iVar10;
        }
        uVar9 = lVar7 + 1;
      } while (uVar9 < uVar11 - 1);
    }
    break;
  case 3:
    if (2 < uVar11) {
      sVar1 = *(short *)needle;
      uVar9 = 0;
      do {
        psVar5 = (short *)memchr(haystack_00 + uVar9,(uint)(byte)sVar1,(uVar11 - 2) - uVar9);
        if (psVar5 == (short *)0x0) {
          return 0xffffffffffffffff;
        }
        if ((sVar1 == *psVar5) && ((uchar)psVar5[1] == needle[2])) {
          return (long)psVar5 + (iVar10 - (long)haystack_00);
        }
        uVar9 = (long)psVar5 + (1 - (long)haystack_00);
      } while (uVar9 < uVar11 - 2);
    }
    break;
  case 4:
    if (3 < uVar11) {
      uVar2 = *(uint *)needle;
      uVar9 = 0;
      do {
        puVar6 = (uint *)memchr(haystack_00 + uVar9,uVar2 & 0xff,(uVar11 - 3) - uVar9);
        if (puVar6 == (uint *)0x0) {
          return 0xffffffffffffffff;
        }
        lVar7 = (long)puVar6 - (long)haystack_00;
        if (uVar2 == *puVar6) goto LAB_010f7fdc;
        uVar9 = lVar7 + 1;
      } while (uVar9 < uVar11 - 3);
    }
    break;
  case 5:
    needle_size_00 = 5;
    goto LAB_010f7f37;
  case 6:
    needle_size_00 = 6;
    goto LAB_010f7f37;
  case 7:
    needle_size_00 = 7;
LAB_010f7f37:
    iVar10 = Contains<unsigned_int,duckdb::ContainsUnaligned>
                       (haystack_00,uVar11,needle,needle_size_00,iVar10);
    return iVar10;
  case 8:
    if (7 < uVar11) {
      lVar3 = *(long *)needle;
      uVar9 = 0;
      do {
        plVar8 = (long *)memchr(haystack_00 + uVar9,(uint)lVar3 & 0xff,(uVar11 - 7) - uVar9);
        if (plVar8 == (long *)0x0) {
          return 0xffffffffffffffff;
        }
        lVar7 = (long)plVar8 - (long)haystack_00;
        if (lVar3 == *plVar8) goto LAB_010f7fdc;
        uVar9 = lVar7 + 1;
      } while (uVar9 < uVar11 - 7);
    }
    break;
  default:
    if (uVar11 < needle_size) {
      return 0xffffffffffffffff;
    }
    uVar11 = (uVar11 + 1) - needle_size;
    if (uVar11 == 0) {
      return 0xffffffffffffffff;
    }
    lVar3 = *(long *)needle;
    uVar9 = 0;
    do {
      plVar8 = (long *)memchr(haystack_00 + uVar9,(uint)lVar3 & 0xff,uVar11 - uVar9);
      if (plVar8 == (long *)0x0) {
        return 0xffffffffffffffff;
      }
      if ((lVar3 == *plVar8) && (iVar4 = bcmp(plVar8 + 1,needle + 8,needle_size - 8), iVar4 == 0)) {
        return (long)plVar8 + (iVar10 - (long)haystack_00);
      }
      uVar9 = (long)plVar8 + (1 - (long)haystack_00);
    } while (uVar9 < uVar11);
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t FindStrInStr(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle, idx_t needle_size) {
	D_ASSERT(needle_size > 0);
	// start off by performing a memchr to find the first character of the
	auto location = memchr(haystack, needle[0], haystack_size);
	if (location == nullptr) {
		return DConstants::INVALID_INDEX;
	}
	idx_t base_offset = UnsafeNumericCast<idx_t>(const_uchar_ptr_cast(location) - haystack);
	haystack_size -= base_offset;
	haystack = const_uchar_ptr_cast(location);
	// switch algorithm depending on needle size
	switch (needle_size) {
	case 1:
		return base_offset;
	case 2:
		return Contains<uint16_t, ContainsAligned>(haystack, haystack_size, needle, 2, base_offset);
	case 3:
		return Contains<uint16_t, ContainsUnaligned>(haystack, haystack_size, needle, 3, base_offset);
	case 4:
		return Contains<uint32_t, ContainsAligned>(haystack, haystack_size, needle, 4, base_offset);
	case 5:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 5, base_offset);
	case 6:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 6, base_offset);
	case 7:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 7, base_offset);
	case 8:
		return Contains<uint64_t, ContainsAligned>(haystack, haystack_size, needle, 8, base_offset);
	default:
		return Contains<uint64_t, ContainsGeneric>(haystack, haystack_size, needle, needle_size, base_offset);
	}
}